

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Icosahedron.cpp
# Opt level: O2

vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> * __thiscall
OpenMD::Icosahedron::ih
          (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
           *__return_storage_ptr__,Icosahedron *this,int n)

{
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *this_00;
  pointer ptVar1;
  int iVar2;
  pointer ppVar3;
  Vector<double,_3U> *v1_00;
  int iVar4;
  int iVar5;
  pointer ptVar6;
  bool bVar7;
  double s;
  double dVar8;
  double s_00;
  Vector3d e1;
  Vector3d e2;
  Vector3d v2;
  Vector3d v1;
  Vector3d e3;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  if (-1 < n) {
    if (n == 0) {
      Vector<double,_3U>::Vector(&e1.super_Vector<double,_3U>);
      e1.super_Vector<double,_3U>.data_[0] = 0.0;
      e1.super_Vector<double,_3U>.data_[1] = 0.0;
      e1.super_Vector<double,_3U>.data_[2] = 0.0;
      std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
      emplace_back<OpenMD::Vector3<double>>
                ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)
                 &this->Points,(Vector3<double> *)&e1.super_Vector<double,_3U>);
    }
    else {
      this_00 = &this->Points;
      s = (double)n;
      for (v1_00 = &((this->Basis).
                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>;
          v1_00 != &((this->Basis).
                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->super_Vector<double,_3U>;
          v1_00 = v1_00 + 1) {
        operator*(&e2.super_Vector<double,_3U>,v1_00,s);
        Vector<double,_3U>::Vector(&e1.super_Vector<double,_3U>,&e2.super_Vector<double,_3U>);
        std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
        emplace_back<OpenMD::Vector3<double>>
                  ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)
                   this_00,(Vector3<double> *)&e1.super_Vector<double,_3U>);
      }
      if (1 < n) {
        for (ppVar3 = (this->Edges).
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar3 != (this->Edges).
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; ppVar3 = ppVar3 + 1) {
          operator*(&e2.super_Vector<double,_3U>,
                    &(this->Basis).
                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[ppVar3->first].
                     super_Vector<double,_3U>,s);
          Vector<double,_3U>::Vector(&e1.super_Vector<double,_3U>,&e2.super_Vector<double,_3U>);
          operator*(&e3.super_Vector<double,_3U>,
                    &(this->Basis).
                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[ppVar3->second].
                     super_Vector<double,_3U>,s);
          Vector<double,_3U>::Vector(&e2.super_Vector<double,_3U>,&e3.super_Vector<double,_3U>);
          dVar8 = 1.0;
          iVar4 = n + -1;
          while (bVar7 = iVar4 != 0, iVar4 = iVar4 + -1, bVar7) {
            operator-(&local_78,&e2.super_Vector<double,_3U>,&e1.super_Vector<double,_3U>);
            operator*(&local_60,&local_78,dVar8);
            operator/(&v2.super_Vector<double,_3U>,&local_60,s);
            operator+(&v1.super_Vector<double,_3U>,&e1.super_Vector<double,_3U>,
                      &v2.super_Vector<double,_3U>);
            Vector<double,_3U>::Vector(&e3.super_Vector<double,_3U>,&v1.super_Vector<double,_3U>);
            std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
            emplace_back<OpenMD::Vector3<double>>
                      ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)
                       this_00,(Vector3<double> *)&e3.super_Vector<double,_3U>);
            dVar8 = dVar8 + 1.0;
          }
        }
        if (n != 2) {
          ptVar1 = (this->Facets).
                   super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (ptVar6 = (this->Facets).
                        super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; ptVar6 != ptVar1;
              ptVar6 = ptVar6 + 1) {
            operator*(&e2.super_Vector<double,_3U>,
                      &(this->Basis).
                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [(ptVar6->super__Tuple_impl<0UL,_int,_int,_int>).
                        super__Head_base<0UL,_int,_false>._M_head_impl].super_Vector<double,_3U>,s);
            Vector<double,_3U>::Vector(&e1.super_Vector<double,_3U>,&e2.super_Vector<double,_3U>);
            operator*(&e3.super_Vector<double,_3U>,
                      &(this->Basis).
                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [(ptVar6->super__Tuple_impl<0UL,_int,_int,_int>).
                        super__Tuple_impl<1UL,_int,_int>.super__Head_base<1UL,_int,_false>.
                        _M_head_impl].super_Vector<double,_3U>,s);
            Vector<double,_3U>::Vector(&e2.super_Vector<double,_3U>,&e3.super_Vector<double,_3U>);
            operator*(&v1.super_Vector<double,_3U>,
                      &(this->Basis).
                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [(ptVar6->super__Tuple_impl<0UL,_int,_int,_int>).
                        super__Tuple_impl<1UL,_int,_int>.super__Tuple_impl<2UL,_int>.
                        super__Head_base<2UL,_int,_false>._M_head_impl].super_Vector<double,_3U>,s);
            Vector<double,_3U>::Vector(&e3.super_Vector<double,_3U>,&v1.super_Vector<double,_3U>);
            iVar5 = 1;
            for (iVar4 = 2; iVar4 != n; iVar4 = iVar4 + 1) {
              operator-(&local_90,&e2.super_Vector<double,_3U>,&e1.super_Vector<double,_3U>);
              iVar2 = iVar5 + 1;
              dVar8 = (double)iVar2;
              operator*(&local_78,&local_90,dVar8);
              operator/(&local_60,&local_78,s);
              operator+(&v2.super_Vector<double,_3U>,&e1.super_Vector<double,_3U>,&local_60);
              Vector<double,_3U>::Vector(&v1.super_Vector<double,_3U>,&v2.super_Vector<double,_3U>);
              operator-(&local_a8,&e3.super_Vector<double,_3U>,&e1.super_Vector<double,_3U>);
              operator*(&local_90,&local_a8,dVar8);
              operator/(&local_78,&local_90,s);
              operator+(&local_60,&e1.super_Vector<double,_3U>,&local_78);
              Vector<double,_3U>::Vector(&v2.super_Vector<double,_3U>,&local_60);
              s_00 = 1.0;
              while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
                operator-(&local_48,&v2.super_Vector<double,_3U>,&v1.super_Vector<double,_3U>);
                operator*(&local_a8,&local_48,s_00);
                operator/(&local_90,&local_a8,dVar8);
                operator+(&local_78,&v1.super_Vector<double,_3U>,&local_90);
                Vector<double,_3U>::Vector(&local_60,&local_78);
                std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
                emplace_back<OpenMD::Vector3<double>>
                          ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>
                            *)this_00,(Vector3<double> *)&local_60);
                s_00 = s_00 + 1.0;
              }
              iVar5 = iVar2;
            }
          }
        }
      }
    }
  }
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            (__return_storage_ptr__,&this->Points);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vector3d> Icosahedron::ih(int n) {
    if (n < 0) return Points;

    if (n == 0) {
      // center particle only

      Points.push_back(Vector3d(0.0, 0.0, 0.0));
      return Points;
    }

    //
    // Generate edge particles
    //
    for (std::vector<Vector3d>::iterator i = Basis.begin(); i != Basis.end();
         ++i) {
      Points.push_back((*i) * RealType(n));
    }

    //
    // Generate side particles
    //
    if (n < 2) return Points;

    for (std::vector<std::pair<int, int>>::iterator i = Edges.begin();
         i != Edges.end(); ++i) {
      Vector3d e1 = Basis[(*i).first] * RealType(n);
      Vector3d e2 = Basis[(*i).second] * RealType(n);

      for (int j = 1; j <= n - 1; j++) {
        Points.push_back(e1 + (e2 - e1) * RealType(j) / RealType(n));
      }
    }

    //
    // Generate body particles
    //
    if (n < 3) return Points;

    for (const auto& [first, second, third] : Facets) {
      Vector3d e1 = Basis[first] * RealType(n);
      Vector3d e2 = Basis[second] * RealType(n);
      Vector3d e3 = Basis[third] * RealType(n);

      for (int j = 1; j <= n - 2; j++) {
        Vector3d v1 = e1 + (e2 - e1) * RealType(j + 1) / RealType(n);
        Vector3d v2 = e1 + (e3 - e1) * RealType(j + 1) / RealType(n);

        for (int k = 1; k <= j; k++) {
          Points.push_back(v1 + (v2 - v1) * RealType(k) / RealType(j + 1));
        }
      }
    }

    return Points;
  }